

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void cppurses::System::set_head(Widget *new_head)

{
  Widget *args;
  Area local_20;
  Widget *local_10;
  Widget *new_head_local;
  
  local_10 = new_head;
  if (head_ != (Widget *)0x0) {
    Widget::disable(head_,true,true);
  }
  head_ = local_10;
  if (local_10 != (Widget *)0x0) {
    (*local_10->_vptr_Widget[2])(local_10,1);
    args = head_;
    local_20.width = Terminal::width((Terminal *)terminal);
    local_20.height = Terminal::height((Terminal *)terminal);
    post_event<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>(args,&local_20);
  }
  return;
}

Assistant:

void System::set_head(Widget* new_head)
{
    if (head_ != nullptr)
        head_->disable();
    head_ = new_head;
    if (head_ != nullptr) {
        head_->enable();
        post_event<Resize_event>(*head_,
                                 Area{terminal.width(), terminal.height()});
    }
}